

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::
createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 param_3,
          Parameters *param_4)

{
  Parameters *extraout_RDX;
  Parameters *extraout_RDX_00;
  Parameters *extraout_RDX_01;
  Parameters *extraout_RDX_02;
  string local_378;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_358;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_338;
  Environment env;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_2d8;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_2b8;
  Resources res3;
  Resources res2;
  Resources res1;
  Resources res0;
  
  Environment::Environment(&env,(Context *)this,1);
  ComputePipeline::Resources::Resources(&res0,&env,extraout_RDX);
  ComputePipeline::Resources::Resources(&res1,&env,extraout_RDX_00);
  ComputePipeline::Resources::Resources(&res2,&env,extraout_RDX_01);
  ComputePipeline::Resources::Resources(&res3,&env,extraout_RDX_02);
  ComputePipeline::create((Move<vk::Handle<(vk::HandleType)18>_> *)&local_358,&env,&res0,param_4);
  local_378.field_2._M_allocated_capacity = (size_type)local_358.m_data.deleter.m_device;
  local_378.field_2._8_8_ = local_358.m_data.deleter.m_allocator;
  local_378._M_dataplus._M_p = (pointer)local_358.m_data.object.m_internal;
  local_378._M_string_length = (size_type)local_358.m_data.deleter.m_deviceIface;
  local_358.m_data.object.m_internal = 0;
  local_358.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_358.m_data.deleter.m_device = (VkDevice)0x0;
  local_358.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_358);
  ComputePipeline::create((Move<vk::Handle<(vk::HandleType)18>_> *)&local_338,&env,&res1,param_4);
  local_358.m_data.deleter.m_device = local_338.m_data.deleter.m_device;
  local_358.m_data.deleter.m_allocator = local_338.m_data.deleter.m_allocator;
  local_358.m_data.object.m_internal = local_338.m_data.object.m_internal;
  local_358.m_data.deleter.m_deviceIface = local_338.m_data.deleter.m_deviceIface;
  local_338.m_data.object.m_internal = 0;
  local_338.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_338.m_data.deleter.m_device = (VkDevice)0x0;
  local_338.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_338);
  ComputePipeline::create((Move<vk::Handle<(vk::HandleType)18>_> *)&local_2d8,&env,&res2,param_4);
  local_338.m_data.deleter.m_device = local_2d8.m_data.deleter.m_device;
  local_338.m_data.deleter.m_allocator = local_2d8.m_data.deleter.m_allocator;
  local_338.m_data.object.m_internal = local_2d8.m_data.object.m_internal;
  local_338.m_data.deleter.m_deviceIface = local_2d8.m_data.deleter.m_deviceIface;
  local_2d8.m_data.object.m_internal = 0;
  local_2d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_2d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_2d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_2d8);
  ComputePipeline::create((Move<vk::Handle<(vk::HandleType)18>_> *)&local_2b8,&env,&res3,param_4);
  local_2d8.m_data.deleter.m_device = local_2b8.m_data.deleter.m_device;
  local_2d8.m_data.deleter.m_allocator = local_2b8.m_data.deleter.m_allocator;
  local_2d8.m_data.object.m_internal = local_2b8.m_data.object.m_internal;
  local_2d8.m_data.deleter.m_deviceIface = local_2b8.m_data.deleter.m_deviceIface;
  local_2b8.m_data.object.m_internal = 0;
  local_2b8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_2b8.m_data.deleter.m_device = (VkDevice)0x0;
  local_2b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_2b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_2d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_338);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_358);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&local_378);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"Ok",(allocator<char> *)&local_358);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  ComputePipeline::Resources::~Resources(&res3);
  ComputePipeline::Resources::~Resources(&res2);
  ComputePipeline::Resources::~Resources(&res1);
  ComputePipeline::Resources::~Resources(&res0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}